

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void zlib_decompress_cleanup(ssh_decompressor *dc)

{
  ssh_decompressor *ztab;
  zlib_decompress_ctx *dctx;
  ssh_decompressor *dc_local;
  
  ztab = dc + -0x1038;
  if ((dc[-0x1036].vt != (ssh_compression_alg *)0x0) && (dc[-0x1036].vt != ztab->vt)) {
    zlib_freetable((zlib_table **)(dc + -0x1036));
  }
  if ((dc[-0x1035].vt != (ssh_compression_alg *)0x0) && (dc[-0x1035].vt != dc[-0x1037].vt)) {
    zlib_freetable((zlib_table **)(dc + -0x1035));
  }
  if (dc[-0x1034].vt != (ssh_compression_alg *)0x0) {
    zlib_freetable((zlib_table **)(dc + -0x1034));
  }
  zlib_freetable((zlib_table **)ztab);
  zlib_freetable((zlib_table **)(dc + -0x1037));
  if (dc[-1].vt != (ssh_compression_alg *)0x0) {
    strbuf_free((strbuf *)dc[-1].vt);
  }
  safefree(ztab);
  return;
}

Assistant:

void zlib_decompress_cleanup(ssh_decompressor *dc)
{
    struct zlib_decompress_ctx *dctx =
        container_of(dc, struct zlib_decompress_ctx, dc);

    if (dctx->currlentable && dctx->currlentable != dctx->staticlentable)
        zlib_freetable(&dctx->currlentable);
    if (dctx->currdisttable && dctx->currdisttable != dctx->staticdisttable)
        zlib_freetable(&dctx->currdisttable);
    if (dctx->lenlentable)
        zlib_freetable(&dctx->lenlentable);
    zlib_freetable(&dctx->staticlentable);
    zlib_freetable(&dctx->staticdisttable);
    if (dctx->outblk)
        strbuf_free(dctx->outblk);
    sfree(dctx);
}